

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall SimpleString::setInternalBufferToNewBuffer(SimpleString *this,size_t bufferSize)

{
  char *pcVar1;
  SimpleString *in_RSI;
  char *in_RDI;
  
  deallocateInternalBuffer(in_RSI);
  *(SimpleString **)(in_RDI + 8) = in_RSI;
  pcVar1 = allocStringBuffer((size_t)in_RSI,in_RDI,0x175e6e);
  *(char **)in_RDI = pcVar1;
  **(undefined1 **)in_RDI = 0;
  return;
}

Assistant:

void SimpleString::setInternalBufferToNewBuffer(size_t bufferSize)
{
    deallocateInternalBuffer();

    bufferSize_ = bufferSize;
    buffer_ = allocStringBuffer(bufferSize_, __FILE__, __LINE__);
    buffer_[0] = '\0';
}